

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

int mallopt(int param_number,int value)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  uVar2 = (ulong)value;
  if (param_number == -3) {
    psVar1 = &mparams.mmap_threshold;
  }
  else if (param_number == -1) {
    psVar1 = &mparams.trim_threshold;
  }
  else {
    if (param_number != -2) {
      return 0;
    }
    if (uVar2 < mparams.page_size) {
      return 0;
    }
    uVar3 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
    uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
    if (1 < (byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)) {
      return 0;
    }
    psVar1 = &mparams.granularity;
  }
  *psVar1 = uVar2;
  return 1;
}

Assistant:

int dlmallopt(int param_number, int value) {
  return change_mparam(param_number, value);
}